

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void yy_flush_buffer(YY_BUFFER_STATE b)

{
  YY_BUFFER_STATE in_RDI;
  YY_BUFFER_STATE local_18;
  
  if (in_RDI != (YY_BUFFER_STATE)0x0) {
    in_RDI->yy_n_chars = 0;
    *in_RDI->yy_ch_buf = '\0';
    in_RDI->yy_ch_buf[1] = '\0';
    in_RDI->yy_buf_pos = in_RDI->yy_ch_buf;
    in_RDI->yy_at_bol = 1;
    in_RDI->yy_buffer_status = 0;
    if (yy_buffer_stack == (YY_BUFFER_STATE *)0x0) {
      local_18 = (YY_BUFFER_STATE)0x0;
    }
    else {
      local_18 = yy_buffer_stack[yy_buffer_stack_top];
    }
    if (in_RDI == local_18) {
      yy_load_buffer_state();
    }
  }
  return;
}

Assistant:

void yy_flush_buffer (YY_BUFFER_STATE  b )
{
    	if ( ! b )
		return;

	b->yy_n_chars = 0;

	/* We always need two end-of-buffer characters.  The first causes
	 * a transition to the end-of-buffer state.  The second causes
	 * a jam in that state.
	 */
	b->yy_ch_buf[0] = YY_END_OF_BUFFER_CHAR;
	b->yy_ch_buf[1] = YY_END_OF_BUFFER_CHAR;

	b->yy_buf_pos = &b->yy_ch_buf[0];

	b->yy_at_bol = 1;
	b->yy_buffer_status = YY_BUFFER_NEW;

	if ( b == YY_CURRENT_BUFFER )
		yy_load_buffer_state(  );
}